

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ComparisonTestTU<int,unsigned_char>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<int,unsigned_char>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<int,unsigned_char>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<int,_unsigned_char>::b1 = LessThanTest<int,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<int,unsigned_char>()::b1);
    }
  }
  if (ComparisonTestTU<int,unsigned_char>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<int,unsigned_char>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<int,_unsigned_char>::b2 = LessThanEqualTest<int,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<int,unsigned_char>()::b2);
    }
  }
  if (ComparisonTestTU<int,unsigned_char>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<int,unsigned_char>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<int,_unsigned_char>::b3 = false;
      __cxa_guard_release(&ComparisonTestTU<int,unsigned_char>()::b3);
    }
  }
  if (ComparisonTestTU<int,unsigned_char>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<int,unsigned_char>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<int,_unsigned_char>::b4 = false;
      __cxa_guard_release(&ComparisonTestTU<int,unsigned_char>()::b4);
    }
  }
  if (ComparisonTestTU<int,unsigned_char>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<int,unsigned_char>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<int,_unsigned_char>::b5 = false;
      __cxa_guard_release(&ComparisonTestTU<int,unsigned_char>()::b5);
    }
  }
  if (ComparisonTestTU<int,unsigned_char>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<int,unsigned_char>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<int,_unsigned_char>::b6 = NotEqualTest<int,unsigned_char>();
      __cxa_guard_release(&ComparisonTestTU<int,unsigned_char>()::b6);
      return;
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}